

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O1

void __thiscall
TPZStream::Read<int>(TPZStream *this,set<int,_std::less<int>,_std::allocator<int>_> *vec)

{
  undefined8 in_RAX;
  int iVar1;
  int nel;
  int val;
  undefined8 local_28;
  
  local_28 = in_RAX;
  (*this->_vptr_TPZStream[0x1d])(this,&local_28,1);
  if (0 < (int)local_28) {
    iVar1 = 0;
    do {
      (*this->_vptr_TPZStream[0x1d])(this,(int *)((long)&local_28 + 4),1);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)vec,
                 (int *)((long)&local_28 + 4));
      iVar1 = iVar1 + 1;
    } while (iVar1 < (int)local_28);
  }
  return;
}

Assistant:

void Read(std::set<T> &vec) {
        if constexpr (std::is_same<std::string, T>::value || is_arithmetic_pz<T>::value){
        int nel;
        this->Read(&nel, 1);
        for (int i = 0; i < nel; i++) {
            T val;
            this->Read(&val);
            vec.insert(val);
        }
        }else{
            DebugStop();
        }
    }